

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::permute_axes(CImg<unsigned_int> *this,char *order)

{
  CImg<unsigned_int> *pCVar1;
  uint foo;
  uint local_34;
  CImg<unsigned_int> local_30;
  
  local_34 = 0;
  _get_permute_axes<unsigned_int>(&local_30,this,order,&local_34);
  pCVar1 = move_to(&local_30,this);
  if ((local_30._is_shared == false) && (local_30._data != (uint *)0x0)) {
    operator_delete__(local_30._data);
  }
  return pCVar1;
}

Assistant:

CImg<T>& permute_axes(const char *const order) {
      return get_permute_axes(order).move_to(*this);
    }